

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O2

void QUnifiedTimer::pauseAnimationTimer(QAbstractAnimationTimer *timer,int duration)

{
  bool bVar1;
  QUnifiedTimer *this;
  
  this = instance();
  if (timer->isRegistered == false) {
    startAnimationTimer(timer);
  }
  bVar1 = timer->isPaused;
  timer->isPaused = true;
  timer->pauseDuration = duration;
  if (bVar1 == false) {
    QList<QAbstractAnimationTimer_*>::append(&this->pausedAnimationTimers,timer);
  }
  localRestart((QUnifiedTimer *)this);
  return;
}

Assistant:

void QUnifiedTimer::pauseAnimationTimer(QAbstractAnimationTimer *timer, int duration)
{
    QUnifiedTimer *inst = QUnifiedTimer::instance();
    if (!timer->isRegistered)
        inst->startAnimationTimer(timer);

    bool timerWasPaused = timer->isPaused;
    timer->isPaused = true;
    timer->pauseDuration = duration;
    if (!timerWasPaused)
        inst->pausedAnimationTimers << timer;
    inst->localRestart();
}